

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_180f112::AV1HighbdCompAvgPredTest::~AV1HighbdCompAvgPredTest
          (AV1HighbdCompAvgPredTest *this)

{
  (this->
  super_TestWithParam<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__AV1HighbdCompAvgPredTest_00f4a090;
  (this->
  super_TestWithParam<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
  ).
  super_WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AV1HighbdCompAvgPredTest_00f4a0d0;
  aom_free(this->comp_pred1_);
  aom_free(this->comp_pred2_);
  aom_free(this->pred_);
  aom_free(this->ref_);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

AV1HighbdCompAvgPredTest::~AV1HighbdCompAvgPredTest() {
  aom_free(comp_pred1_);
  aom_free(comp_pred2_);
  aom_free(pred_);
  aom_free(ref_);
}